

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall
tonk::Connection::resetTimers
          (Connection *this,uint32_t noDataTimeoutUsec,bool connectionEstablished)

{
  ostringstream *this_00;
  uint64_t nowUsec;
  OutputWorker *this_01;
  undefined7 in_register_00000011;
  uint64_t timeoutUsec;
  undefined1 local_1b0 [392];
  
  nowUsec = siamese::GetTimeUsec();
  LOCK();
  (this->LastTickUsec).super___atomic_base<unsigned_long>._M_i = nowUsec;
  UNLOCK();
  Timer::SetTimeoutUsec(&this->NoDataTimer,(ulong)noDataTimeoutUsec,Stop);
  Timer::Start(&this->NoDataTimer,nowUsec);
  timeoutUsec = 500000;
  if ((int)CONCAT71(in_register_00000011,connectionEstablished) != 0) {
    timeoutUsec = 2000000;
  }
  Timer::SetTimeoutUsec(&this->TimeSyncTimer,timeoutUsec,Restart);
  Timer::Start(&this->TimeSyncTimer,nowUsec);
  Timer::SetTimeoutUsec(&this->AcknowledgementTimer,50000,Restart);
  Timer::Start(&this->AcknowledgementTimer,nowUsec);
  Timer::SetTimeoutUsec(&this->AppTimer,(ulong)this->SocketConfig->TimerIntervalUsec,Restart);
  Timer::Start(&this->AppTimer,nowUsec);
  if ((int)(this->Logger).ChannelMinLevel < 2) {
    local_1b0._0_8_ = (this->Logger).ChannelName;
    this_00 = (ostringstream *)(local_1b0 + 0x10);
    local_1b0._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(this->Logger).Prefix._M_dataplus._M_p,
               (this->Logger).Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Reset no data timeout to ",0x19);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," usec",5);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b0);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  return;
}

Assistant:

void Connection::resetTimers(uint32_t noDataTimeoutUsec, bool connectionEstablished)
{
    const uint64_t nowUsec = GetTicksUsec();

    // Tick the no-data timeout once
    NoDataTimer.SetTimeoutUsec(noDataTimeoutUsec, Timer::Behavior::Stop);
    NoDataTimer.Start(nowUsec);

    // Tick the flow control timer repeatedly
    TimeSyncTimer.SetTimeoutUsec(
        connectionEstablished ? protocol::kTimeSyncIntervalUsec : protocol::kConnectionIntervalUsec,
        Timer::Behavior::Restart);
    TimeSyncTimer.Start(nowUsec);

    // Tick the acknowledgement timer repeatedly
    AcknowledgementTimer.SetTimeoutUsec(protocol::kMinAckIntervalUsec, Timer::Behavior::Restart);
    AcknowledgementTimer.Start(nowUsec);

    // Tick the app's OnTick() timer repeatedly
    AppTimer.SetTimeoutUsec(SocketConfig->TimerIntervalUsec, Timer::Behavior::Restart);
    AppTimer.Start(nowUsec);

    Logger.Debug("Reset no data timeout to ", noDataTimeoutUsec, " usec");
}